

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcicc.c
# Opt level: O2

void jpeg_write_icc_profile(j_compress_ptr cinfo,JOCTET *icc_data_ptr,uint icc_data_len)

{
  jpeg_error_mgr *pjVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  bool bVar6;
  bool bVar7;
  
  if (icc_data_ptr == (JOCTET *)0x0 || icc_data_len == 0) {
    pjVar1 = cinfo->err;
    pjVar1->msg_code = 0x17;
    (*pjVar1->error_exit)((j_common_ptr)cinfo);
  }
  iVar4 = cinfo->global_state;
  if (iVar4 < 0x65) {
    pjVar1 = cinfo->err;
    pjVar1->msg_code = 0x14;
    (pjVar1->msg_parm).i[0] = iVar4;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  uVar2 = icc_data_len / 0xffef;
  bVar7 = uVar2 * 0xffef != icc_data_len;
  iVar4 = 1;
  for (; icc_data_len != 0; icc_data_len = icc_data_len - uVar5) {
    uVar5 = 0xffef;
    if (icc_data_len < 0xffef) {
      uVar5 = icc_data_len;
    }
    jpeg_write_m_header(cinfo,0xe2,uVar5 + 0xe);
    jpeg_write_m_byte(cinfo,0x49);
    jpeg_write_m_byte(cinfo,0x43);
    jpeg_write_m_byte(cinfo,0x43);
    jpeg_write_m_byte(cinfo,0x5f);
    jpeg_write_m_byte(cinfo,0x50);
    jpeg_write_m_byte(cinfo,0x52);
    jpeg_write_m_byte(cinfo,0x4f);
    jpeg_write_m_byte(cinfo,0x46);
    jpeg_write_m_byte(cinfo,0x49);
    jpeg_write_m_byte(cinfo,0x4c);
    jpeg_write_m_byte(cinfo,0x45);
    jpeg_write_m_byte(cinfo,0);
    jpeg_write_m_byte(cinfo,iVar4);
    jpeg_write_m_byte(cinfo,bVar7 + uVar2);
    uVar3 = uVar5;
    while (bVar6 = uVar3 != 0, uVar3 = uVar3 - 1, bVar6) {
      jpeg_write_m_byte(cinfo,(uint)*icc_data_ptr);
      icc_data_ptr = icc_data_ptr + 1;
    }
    iVar4 = iVar4 + 1;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_write_icc_profile(j_compress_ptr cinfo, const JOCTET *icc_data_ptr,
                       unsigned int icc_data_len)
{
  unsigned int num_markers;     /* total number of markers we'll write */
  int cur_marker = 1;           /* per spec, counting starts at 1 */
  unsigned int length;          /* number of bytes to write in this marker */

  if (icc_data_ptr == NULL || icc_data_len == 0)
    ERREXIT(cinfo, JERR_BUFFER_SIZE);
  if (cinfo->global_state < CSTATE_SCANNING)
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);

  /* Calculate the number of markers we'll need, rounding up of course */
  num_markers = icc_data_len / MAX_DATA_BYTES_IN_MARKER;
  if (num_markers * MAX_DATA_BYTES_IN_MARKER != icc_data_len)
    num_markers++;

  while (icc_data_len > 0) {
    /* length of profile to put in this marker */
    length = icc_data_len;
    if (length > MAX_DATA_BYTES_IN_MARKER)
      length = MAX_DATA_BYTES_IN_MARKER;
    icc_data_len -= length;

    /* Write the JPEG marker header (APP2 code and marker length) */
    jpeg_write_m_header(cinfo, ICC_MARKER,
                        (unsigned int)(length + ICC_OVERHEAD_LEN));

    /* Write the marker identifying string "ICC_PROFILE" (null-terminated).  We
     * code it in this less-than-transparent way so that the code works even if
     * the local character set is not ASCII.
     */
    jpeg_write_m_byte(cinfo, 0x49);
    jpeg_write_m_byte(cinfo, 0x43);
    jpeg_write_m_byte(cinfo, 0x43);
    jpeg_write_m_byte(cinfo, 0x5F);
    jpeg_write_m_byte(cinfo, 0x50);
    jpeg_write_m_byte(cinfo, 0x52);
    jpeg_write_m_byte(cinfo, 0x4F);
    jpeg_write_m_byte(cinfo, 0x46);
    jpeg_write_m_byte(cinfo, 0x49);
    jpeg_write_m_byte(cinfo, 0x4C);
    jpeg_write_m_byte(cinfo, 0x45);
    jpeg_write_m_byte(cinfo, 0x0);

    /* Add the sequencing info */
    jpeg_write_m_byte(cinfo, cur_marker);
    jpeg_write_m_byte(cinfo, (int)num_markers);

    /* Add the profile data */
    while (length--) {
      jpeg_write_m_byte(cinfo, *icc_data_ptr);
      icc_data_ptr++;
    }
    cur_marker++;
  }
}